

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_digest.c
# Opt level: O3

CURLcode Curl_output_digest(connectdata *conn,_Bool proxy,uchar *request,uchar *uripath)

{
  char *pcVar1;
  Curl_easy *data;
  char **ppcVar2;
  byte bVar3;
  CURLcode CVar4;
  uchar *puVar5;
  uint uVar6;
  long lVar7;
  int iVar8;
  undefined7 in_register_00000031;
  char **ppcVar9;
  char *pcVar10;
  char *pcVar11;
  char *response;
  long local_60;
  char *local_58;
  char *local_50;
  uchar *local_48;
  uchar *local_40;
  size_t len;
  
  data = conn->data;
  iVar8 = (int)CONCAT71(in_register_00000031,proxy);
  uVar6 = iVar8 << 5;
  ppcVar2 = &conn->user;
  ppcVar9 = &conn->passwd;
  lVar7 = 0x420;
  if (iVar8 != 0) {
    lVar7 = 0x408;
    ppcVar9 = &(conn->http_proxy).passwd;
    ppcVar2 = &(conn->http_proxy).user;
  }
  pcVar11 = *ppcVar9;
  pcVar10 = *ppcVar2;
  local_48 = request;
  local_40 = uripath;
  (*Curl_cfree)(*(void **)((conn->chunk).hexbuffer + lVar7 + -0x20));
  puVar5 = local_40;
  if (pcVar10 == (char *)0x0) {
    pcVar10 = "";
  }
  if (pcVar11 == (char *)0x0) {
    pcVar11 = "";
  }
  pcVar1 = (conn->chunk).hexbuffer + lVar7 + -0x20;
  pcVar1[0] = '\0';
  pcVar1[1] = '\0';
  pcVar1[2] = '\0';
  pcVar1[3] = '\0';
  pcVar1[4] = '\0';
  pcVar1[5] = '\0';
  pcVar1[6] = '\0';
  pcVar1[7] = '\0';
  bVar3 = (&(data->state).authhost.field_0x18)[uVar6];
  if (*(long *)((long)&((digestdata *)((data->state).tempwrite + 4))->nonce +
               (ulong)(uint)(iVar8 << 6)) == 0) {
    bVar3 = bVar3 & 0xfe;
  }
  else {
    local_60 = lVar7;
    local_58 = pcVar10;
    local_50 = pcVar11;
    if (((bVar3 & 4) == 0) || (pcVar11 = strchr((char *)local_40,0x3f), pcVar11 == (char *)0x0)) {
      puVar5 = (uchar *)(*Curl_cstrdup)((char *)puVar5);
    }
    else {
      puVar5 = (uchar *)curl_maprintf("%.*s",(long)pcVar11 - (long)puVar5,puVar5);
    }
    if (puVar5 == (uchar *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    CVar4 = Curl_auth_create_digest_http_message
                      (data,local_58,local_50,local_48,puVar5,
                       (digestdata *)
                       ((long)&((digestdata *)((data->state).tempwrite + 4))->nonce +
                       (ulong)(uint)(iVar8 << 6)),&response,&len);
    (*Curl_cfree)(puVar5);
    if (CVar4 != CURLE_OK) {
      return CVar4;
    }
    pcVar11 = "";
    if (proxy) {
      pcVar11 = "Proxy-";
    }
    pcVar11 = curl_maprintf("%sAuthorization: Digest %s\r\n",pcVar11,response);
    lVar7 = local_60;
    *(char **)((conn->chunk).hexbuffer + local_60 + -0x20) = pcVar11;
    (*Curl_cfree)(response);
    if (*(long *)((conn->chunk).hexbuffer + lVar7 + -0x20) == 0) {
      return CURLE_OUT_OF_MEMORY;
    }
    bVar3 = (&(data->state).authhost.field_0x18)[uVar6] | 1;
  }
  (&(data->state).authhost.field_0x18)[uVar6] = bVar3;
  return CURLE_OK;
}

Assistant:

CURLcode Curl_output_digest(struct connectdata *conn,
                            bool proxy,
                            const unsigned char *request,
                            const unsigned char *uripath)
{
  CURLcode result;
  struct Curl_easy *data = conn->data;
  unsigned char *path = NULL;
  char *tmp = NULL;
  char *response;
  size_t len;
  bool have_chlg;

  /* Point to the address of the pointer that holds the string to send to the
     server, which is for a plain host or for a HTTP proxy */
  char **allocuserpwd;

  /* Point to the name and password for this */
  const char *userp;
  const char *passwdp;

  /* Point to the correct struct with this */
  struct digestdata *digest;
  struct auth *authp;

  if(proxy) {
    digest = &data->state.proxydigest;
    allocuserpwd = &conn->allocptr.proxyuserpwd;
    userp = conn->http_proxy.user;
    passwdp = conn->http_proxy.passwd;
    authp = &data->state.authproxy;
  }
  else {
    digest = &data->state.digest;
    allocuserpwd = &conn->allocptr.userpwd;
    userp = conn->user;
    passwdp = conn->passwd;
    authp = &data->state.authhost;
  }

  Curl_safefree(*allocuserpwd);

  /* not set means empty */
  if(!userp)
    userp = "";

  if(!passwdp)
    passwdp = "";

#if defined(USE_WINDOWS_SSPI)
  have_chlg = digest->input_token ? TRUE : FALSE;
#else
  have_chlg = digest->nonce ? TRUE : FALSE;
#endif

  if(!have_chlg) {
    authp->done = FALSE;
    return CURLE_OK;
  }

  /* So IE browsers < v7 cut off the URI part at the query part when they
     evaluate the MD5 and some (IIS?) servers work with them so we may need to
     do the Digest IE-style. Note that the different ways cause different MD5
     sums to get sent.

     Apache servers can be set to do the Digest IE-style automatically using
     the BrowserMatch feature:
     https://httpd.apache.org/docs/2.2/mod/mod_auth_digest.html#msie

     Further details on Digest implementation differences:
     http://www.fngtps.com/2006/09/http-authentication
  */

  if(authp->iestyle) {
    tmp = strchr((char *)uripath, '?');
    if(tmp) {
      size_t urilen = tmp - (char *)uripath;
      path = (unsigned char *) aprintf("%.*s", urilen, uripath);
    }
  }
  if(!tmp)
    path = (unsigned char *) strdup((char *) uripath);

  if(!path)
    return CURLE_OUT_OF_MEMORY;

  result = Curl_auth_create_digest_http_message(data, userp, passwdp, request,
                                                path, digest, &response, &len);
  free(path);
  if(result)
    return result;

  *allocuserpwd = aprintf("%sAuthorization: Digest %s\r\n",
                          proxy ? "Proxy-" : "",
                          response);
  free(response);
  if(!*allocuserpwd)
    return CURLE_OUT_OF_MEMORY;

  authp->done = TRUE;

  return CURLE_OK;
}